

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadRegion.cpp
# Opt level: O3

void __thiscall ThreadRegion::ThreadRegion(ThreadRegion *this,Node *node)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  
  iVar2 = lastId + 1;
  this->id_ = lastId;
  lastId = iVar2;
  this->foundingNode_ = node;
  p_Var1 = &(this->nodes_)._M_t._M_impl.super__Rb_tree_header;
  (this->nodes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->nodes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->nodes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->nodes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->nodes_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->predecessors_)._M_t._M_impl.super__Rb_tree_header;
  (this->predecessors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->predecessors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->predecessors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->predecessors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->predecessors_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->successors_)._M_t._M_impl.super__Rb_tree_header;
  (this->successors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->successors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->successors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->successors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->successors_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

ThreadRegion::ThreadRegion(Node *node) : id_(lastId++), foundingNode_(node) {}